

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O0

void __thiscall DPlayerMenu::UpdateSkins(DPlayerMenu *this)

{
  uint uVar1;
  int iVar2;
  AActor *pAVar3;
  uint *puVar4;
  bool bVar5;
  FName local_34;
  uint local_30;
  int local_2c;
  int j;
  int i;
  FListMenuItem *local_20;
  FListMenuItem *li;
  int skin;
  int sel;
  DPlayerMenu *this_local;
  
  li._4_4_ = 0;
  _skin = this;
  FName::FName((FName *)&i,NAME_Skin);
  local_20 = DListMenu::GetItem(&this->super_DListMenu,(FName *)&i);
  if (local_20 != (FListMenuItem *)0x0) {
    pAVar3 = GetDefaultByType((PClass *)this->PlayerClass->Type);
    TFlags<ActorFlag4,_unsigned_int>::operator&
              ((TFlags<ActorFlag4,_unsigned_int> *)&j,
               (int)pAVar3 + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_RANDOMIZE|MF4_BOSSDEATH));
    uVar1 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&j);
    bVar5 = true;
    if (uVar1 == 0) {
      iVar2 = userinfo_t::GetPlayerClassNum((userinfo_t *)((long)consoleplayer * 0x2a0 + 0xd63498));
      bVar5 = iVar2 == -1;
    }
    if (bVar5) {
      (*local_20->_vptr_FListMenuItem[8])(local_20,0,"Base");
      (*local_20->_vptr_FListMenuItem[10])(local_20,0);
      li._0_4_ = 0;
    }
    else {
      TArray<int,_int>::Clear(&this->PlayerSkins);
      for (local_2c = 0; local_2c < (int)numskins; local_2c = local_2c + 1) {
        bVar5 = FPlayerClass::CheckSkin(this->PlayerClass,local_2c);
        if (bVar5) {
          local_30 = TArray<int,_int>::Push(&this->PlayerSkins,&local_2c);
          (*local_20->_vptr_FListMenuItem[8])(local_20,(ulong)local_30,skins + local_2c);
          iVar2 = userinfo_t::GetSkin((userinfo_t *)((long)consoleplayer * 0x2a0 + 0xd63498));
          if (iVar2 == local_2c) {
            li._4_4_ = local_30;
          }
        }
      }
      (*local_20->_vptr_FListMenuItem[10])(local_20,0,(ulong)li._4_4_);
      puVar4 = (uint *)TArray<int,_int>::operator[](&this->PlayerSkins,(long)(int)li._4_4_);
      li._0_4_ = *puVar4;
    }
    FName::FName(&local_34,NAME_Playerdisplay);
    local_20 = DListMenu::GetItem(&this->super_DListMenu,&local_34);
    if (local_20 != (FListMenuItem *)0x0) {
      (*local_20->_vptr_FListMenuItem[10])(local_20,0x10002,(ulong)(uint)li);
    }
  }
  UpdateTranslation(this);
  return;
}

Assistant:

void DPlayerMenu::UpdateSkins()
{
	int sel = 0;
	int skin;
	FListMenuItem *li = GetItem(NAME_Skin);
	if (li != NULL)
	{
		if (GetDefaultByType (PlayerClass->Type)->flags4 & MF4_NOSKIN ||
			players[consoleplayer].userinfo.GetPlayerClassNum() == -1)
		{
			li->SetString(0, "Base");
			li->SetValue(0, 0);
			skin = 0;
		}
		else
		{
			PlayerSkins.Clear();
			for(int i=0;i<(int)numskins; i++)
			{
				if (PlayerClass->CheckSkin(i))
				{
					int j = PlayerSkins.Push(i);
					li->SetString(j, skins[i].name);
					if (players[consoleplayer].userinfo.GetSkin() == i)
					{
						sel = j;
					}
				}
			}
			li->SetValue(0, sel);
			skin = PlayerSkins[sel];
		}
		li = GetItem(NAME_Playerdisplay);
		if (li != NULL)
		{
			li->SetValue(FListMenuItemPlayerDisplay::PDF_SKIN, skin);
		}
	}
	UpdateTranslation();
}